

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locality.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int i;
  pointer piVar4;
  int depth;
  topology topo;
  __shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2> local_a8;
  object obj;
  allocator<int> a;
  vector<int,_hwlocxx::allocator<int>_> v1;
  
  hwlocxx::topology::topology(&topo);
  iVar1 = hwloc_topology_get_depth
                    (topo.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  depth = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; depth != iVar1; depth = depth + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"*** Objects at level ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,depth);
    std::endl<char,std::char_traits<char>>(poVar3);
    i = 0;
    while( true ) {
      iVar2 = hwloc_get_nbobjs_by_depth
                        (topo.topology_.
                         super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr,depth
                        );
      if (iVar2 <= i) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"Index ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,i);
      poVar3 = std::operator<<(poVar3,":");
      hwlocxx::topology::object::object((object *)&v1,&topo,depth,i);
      poVar3 = hwlocxx::operator<<(poVar3,(object *)&v1);
      std::endl<char,std::char_traits<char>>(poVar3);
      i = i + 1;
    }
  }
  iVar1 = hwlocxx::topology::get_width_by_type(&topo,HWLOC_OBJ_NUMANODE);
  hwlocxx::topology::object::object(&obj,&topo,HWLOC_OBJ_NUMANODE,iVar1 + -1);
  std::__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,(__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2> *)&topo);
  std::__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2> *)&a,&local_a8);
  a.obj_.obj_ = obj.obj_;
  a.obj_.topo_ = obj.topo_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::vector<int,_hwlocxx::allocator<int>_>::vector(&v1,10,&a);
  iVar1 = 1;
  for (piVar4 = v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start;
      piVar4 != v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish; piVar4 = piVar4 + 1) {
    *piVar4 = iVar1;
    iVar1 = iVar1 + 1;
  }
  iVar1 = 0;
  for (; v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    iVar1 = iVar1 + *v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  std::_Vector_base<int,_hwlocxx::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_hwlocxx::allocator<int>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&a.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&topo.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0x37 - iVar1;
}

Assistant:

int main()
{
   int depth;
   int i, n;
   int topodepth;

   hwlocxx::topology topo;

   /* Optionally, get some additional topology information
      in case we need the topology depth later. */
   topodepth = topo.get_depth();

   /*
    * Example:
    *   Print the topology
    */
   for (depth = 0; depth < topodepth; depth++)
   {
      std::cout << "*** Objects at level " << depth << std::endl;
      for (i = 0; i < topo.get_width_at_depth(depth); i++)
      {
         std::cout << "Index " << i << ":" << topo.get_obj(depth, i)
                   << std::endl;
      }
   }

   /* Example:
    *    Use the hwlocxx allocator to allocate storage for a vector
    */
   n = topo.get_width_by_type(HWLOC_OBJ_NUMANODE);
   auto obj = topo.get_object_by_type(HWLOC_OBJ_NUMANODE, n - 1);
   hwlocxx::allocator<int> a{topo, obj};

   size_t nElems = 10u;
   std::vector<int, hwlocxx::allocator<int>> v1{nElems, a};
   std::iota(std::begin(v1), std::end(v1), 1);
   auto sum = std::accumulate(std::begin(v1), std::end(v1), 0, std::plus<>());
   auto sumResult = (nElems * (nElems + 1) / 2);
   return static_cast<int>(sumResult - sum);
}